

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int g_write(lua_State *L,FILE *f,int arg)

{
  int iVar1;
  size_t in_RAX;
  TValue *pTVar2;
  char *__ptr;
  size_t sVar3;
  int iVar4;
  uint i;
  size_t l;
  size_t local_38;
  
  iVar4 = (int)((ulong)((long)L->top - (long)L->base) >> 4) + -1;
  if (iVar4 == 0) {
    i = 1;
  }
  else {
    i = 1;
    local_38 = in_RAX;
    do {
      pTVar2 = index2adr(L,arg);
      if ((pTVar2 == &luaO_nilobject_) || (pTVar2->tt != 3)) {
        __ptr = luaL_checklstring(L,arg,&local_38);
        if (i == 0) goto LAB_00111122;
        sVar3 = fwrite(__ptr,1,local_38,(FILE *)f);
        i = (uint)(sVar3 == local_38);
      }
      else if (i == 0) {
LAB_00111122:
        i = 0;
      }
      else {
        lua_tonumber(L,arg);
        iVar1 = fprintf((FILE *)f,"%.14g");
        i = (uint)(0 < iVar1);
      }
      arg = arg + 1;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  iVar4 = pushresult(L,i,(char *)0x0);
  return iVar4;
}

Assistant:

static int g_write(lua_State*L,FILE*f,int arg){
int nargs=lua_gettop(L)-1;
int status=1;
for(;nargs--;arg++){
if(lua_type(L,arg)==3){
status=status&&
fprintf(f,"%.14g",lua_tonumber(L,arg))>0;
}
else{
size_t l;
const char*s=luaL_checklstring(L,arg,&l);
status=status&&(fwrite(s,sizeof(char),l,f)==l);
}
}
return pushresult(L,status,NULL);
}